

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TProtocol.h
# Opt level: O1

uint32_t duckdb_apache::thrift::protocol::skip<duckdb_apache::thrift::protocol::TProtocol>
                   (TProtocol *prot,TType type)

{
  int iVar1;
  uint32_t uVar2;
  int iVar3;
  uint32_t uVar4;
  TException *this;
  TType TVar5;
  uint uVar6;
  uint32_t size;
  uint32_t size_2;
  bool boolv;
  TType local_58;
  uint local_54;
  string local_50;
  
  TProtocol::incrementInputRecursionDepth(prot);
  switch(type) {
  case T_BOOL:
    uVar2 = (*prot->_vptr_TProtocol[0x23])(prot,&local_50);
    break;
  case T_BYTE:
    local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
    uVar2 = (*prot->_vptr_TProtocol[0x25])(prot);
    break;
  case T_DOUBLE:
    uVar2 = (*prot->_vptr_TProtocol[0x29])(prot,&local_50);
    break;
  default:
    this = (TException *)__cxa_allocate_exception(0x30);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"invalid TType","");
    TException::TException(this,&local_50);
    *(undefined ***)this = &PTR__TException_019d52c0;
    *(undefined4 *)(this + 1) = 1;
    __cxa_throw(this,&TProtocolException::typeinfo,TException::~TException);
  case T_I16:
    uVar2 = (*prot->_vptr_TProtocol[0x26])(prot,&local_50);
    break;
  case T_I32:
    uVar2 = (*prot->_vptr_TProtocol[0x27])(prot,&local_50);
    break;
  case T_I64:
    uVar2 = (*prot->_vptr_TProtocol[0x28])(prot,&local_50);
    break;
  case T_STRING:
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    uVar2 = (*prot->_vptr_TProtocol[0x2b])(prot,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    break;
  case T_STRUCT:
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    iVar3 = (*prot->_vptr_TProtocol[0x19])(prot,&local_50);
    while( true ) {
      iVar1 = (*prot->_vptr_TProtocol[0x1b])(prot,&local_50,&local_58,&local_54);
      iVar1 = iVar1 + iVar3;
      if (local_58 == T_STOP) break;
      uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,local_58);
      iVar3 = (*prot->_vptr_TProtocol[0x1c])(prot);
      iVar3 = uVar2 + iVar1 + iVar3;
    }
    iVar3 = (*prot->_vptr_TProtocol[0x1a])(prot);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_010d2a57;
  case T_MAP:
    iVar1 = (*prot->_vptr_TProtocol[0x1d])(prot,&local_50,&local_58,&local_54);
    if (local_54 != 0) {
      uVar6 = 0;
      do {
        uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>
                          (prot,(TType)local_50._M_dataplus._M_p);
        uVar4 = skip<duckdb_apache::thrift::protocol::TProtocol>(prot,local_58);
        iVar1 = iVar1 + uVar2 + uVar4;
        uVar6 = uVar6 + 1;
      } while (uVar6 < local_54);
    }
    iVar3 = (*prot->_vptr_TProtocol[0x1e])(prot);
    goto LAB_010d2a57;
  case T_SET:
    iVar1 = (*prot->_vptr_TProtocol[0x21])(prot,&local_50,&local_58);
    if (local_58 != T_STOP) {
      TVar5 = T_STOP;
      do {
        uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>
                          (prot,(TType)local_50._M_dataplus._M_p);
        iVar1 = iVar1 + uVar2;
        TVar5 = TVar5 + T_VOID;
      } while (TVar5 < local_58);
    }
    iVar3 = (*prot->_vptr_TProtocol[0x22])(prot);
    goto LAB_010d2a57;
  case T_LIST:
    iVar1 = (*prot->_vptr_TProtocol[0x1f])(prot,&local_50,&local_58);
    if (local_58 != T_STOP) {
      TVar5 = T_STOP;
      do {
        uVar2 = skip<duckdb_apache::thrift::protocol::TProtocol>
                          (prot,(TType)local_50._M_dataplus._M_p);
        iVar1 = iVar1 + uVar2;
        TVar5 = TVar5 + T_VOID;
      } while (TVar5 < local_58);
    }
    iVar3 = (*prot->_vptr_TProtocol[0x20])(prot);
LAB_010d2a57:
    uVar2 = iVar3 + iVar1;
  }
  prot->input_recursion_depth_ = prot->input_recursion_depth_ - 1;
  return uVar2;
}

Assistant:

uint32_t skip(Protocol_& prot, TType type) {
  TInputRecursionTracker tracker(prot);

  switch (type) {
  case T_BOOL: {
    bool boolv;
    return prot.readBool(boolv);
  }
  case T_BYTE: {
    int8_t bytev = 0;
    return prot.readByte(bytev);
  }
  case T_I16: {
    int16_t i16;
    return prot.readI16(i16);
  }
  case T_I32: {
    int32_t i32;
    return prot.readI32(i32);
  }
  case T_I64: {
    int64_t i64;
    return prot.readI64(i64);
  }
  case T_DOUBLE: {
    double dub;
    return prot.readDouble(dub);
  }
  case T_STRING: {
    std::string str;
    return prot.readBinary(str);
  }
  case T_STRUCT: {
    uint32_t result = 0;
    std::string name;
    int16_t fid;
    TType ftype;
    result += prot.readStructBegin(name);
    while (true) {
      result += prot.readFieldBegin(name, ftype, fid);
      if (ftype == T_STOP) {
        break;
      }
      result += skip(prot, ftype);
      result += prot.readFieldEnd();
    }
    result += prot.readStructEnd();
    return result;
  }
  case T_MAP: {
    uint32_t result = 0;
    TType keyType;
    TType valType;
    uint32_t i, size;
    result += prot.readMapBegin(keyType, valType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, keyType);
      result += skip(prot, valType);
    }
    result += prot.readMapEnd();
    return result;
  }
  case T_SET: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readSetBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readSetEnd();
    return result;
  }
  case T_LIST: {
    uint32_t result = 0;
    TType elemType;
    uint32_t i, size;
    result += prot.readListBegin(elemType, size);
    for (i = 0; i < size; i++) {
      result += skip(prot, elemType);
    }
    result += prot.readListEnd();
    return result;
  }
  default:
    break;
  }

  throw TProtocolException(TProtocolException::INVALID_DATA,
                           "invalid TType");
}